

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

bool igVSliderFloat(char *label,ImVec2 size,float *v,float v_min,float v_max,char *format,
                   float power)

{
  bool bVar1;
  float power_local;
  char *format_local;
  float v_max_local;
  float v_min_local;
  float *v_local;
  char *label_local;
  ImVec2 size_local;
  
  label_local = (char *)size;
  bVar1 = ImGui::VSliderFloat(label,(ImVec2 *)&label_local,v,v_min,v_max,format,power);
  return bVar1;
}

Assistant:

CIMGUI_API int _igVSliderFloat (char *larg1, ImVec2 const *larg2, float *larg3, float larg4, float larg5, char *larg6, float larg7) {
  int lresult = (int)0 ;
  char *arg1 = (char *) 0 ;
  ImVec2 arg2 ;
  float *arg3 = (float *) 0 ;
  float arg4 ;
  float arg5 ;
  char *arg6 = (char *) 0 ;
  float arg7 ;
  bool result;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = larg3;
  arg4 = larg4;
  arg5 = larg5;
  arg6 = larg6;
  arg7 = larg7;
  try {
    result = (bool)igVSliderFloat((char const *)arg1,arg2,arg3,arg4,arg5,(char const *)arg6,arg7);
    lresult = (int)result;
    return lresult;
  } catch (...) {
    return (int)0;
  }
}